

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u32 jsonTranslateBlobToText(JsonParse *pParse,u32 i,JsonString *pOut)

{
  u8 *puVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  u8 uVar5;
  u32 uVar6;
  int iVar7;
  ulong uVar8;
  char cVar9;
  u32 N;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  u8 *puVar13;
  uint uVar14;
  u32 uVar15;
  u32 sz;
  u32 local_3c;
  ulong local_38;
  
  uVar6 = jsonbPayloadSize(pParse,i,&local_3c);
  if (uVar6 == 0) {
    pOut->eErr = pOut->eErr | 2;
    return pParse->nBlob + 1;
  }
  puVar13 = pParse->aBlob;
  uVar15 = local_3c;
  switch(puVar13[i] & 0xf) {
  case 0:
    pcVar12 = "null";
    goto LAB_001aae91;
  case 1:
    pcVar12 = "true";
LAB_001aae91:
    uVar6 = 4;
LAB_001aae99:
    jsonAppendRawNZ(pOut,pcVar12,uVar6);
    return i + 1;
  case 2:
    pcVar12 = "false";
    uVar6 = 5;
    goto LAB_001aae99;
  case 3:
  case 5:
    if (local_3c != 0) {
      jsonAppendRaw(pOut,(char *)(puVar13 + (uVar6 + i)),local_3c);
      goto LAB_001ab39c;
    }
    break;
  case 4:
    if (local_3c != 0) {
      uVar5 = puVar13[uVar6 + i];
      if (uVar5 == '+') {
LAB_001ab48f:
        uVar10 = 3;
      }
      else {
        uVar10 = 2;
        if (uVar5 == '-') {
          uVar8 = pOut->nUsed;
          if (uVar8 < pOut->nAlloc) {
            pOut->nUsed = uVar8 + 1;
            pOut->zBuf[uVar8] = '-';
          }
          else {
            jsonAppendCharExpand(pOut,'-');
          }
          goto LAB_001ab48f;
        }
      }
      bVar4 = false;
      if (uVar10 < local_3c) {
        uVar11 = (ulong)uVar10;
        uVar8 = 0;
        do {
          bVar2 = (puVar13 + (uVar6 + i))[uVar11];
          if ((""[bVar2] & 8) == 0) {
            pOut->eErr = pOut->eErr | 2;
            break;
          }
          if (uVar8 >> 0x3c == 0) {
            uVar8 = uVar8 << 4 | (ulong)(((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2 & 0xf);
          }
          else {
            bVar4 = true;
          }
          uVar11 = uVar11 + 1;
        } while (local_3c != (u32)uVar11);
        pcVar12 = "9.0e999";
        if (!bVar4) {
          pcVar12 = "%llu";
        }
      }
      else {
        pcVar12 = "%llu";
        uVar8 = 0;
      }
      jsonPrintf(100,pOut,pcVar12,uVar8);
      goto LAB_001ab39c;
    }
    break;
  case 6:
    uVar8 = (ulong)local_3c;
    if (uVar8 != 0) {
      puVar13 = puVar13 + (uVar6 + i);
      uVar10 = 0;
      if (*puVar13 == '-') {
        uVar11 = pOut->nUsed;
        if (uVar11 < pOut->nAlloc) {
          pOut->nUsed = uVar11 + 1;
          pOut->zBuf[uVar11] = '-';
        }
        else {
          jsonAppendCharExpand(pOut,'-');
        }
        uVar10 = 1;
      }
      uVar11 = (ulong)uVar10;
      if (puVar13[uVar11] == '.') {
        uVar3 = pOut->nUsed;
        if (uVar3 < pOut->nAlloc) {
          pOut->nUsed = uVar3 + 1;
          pOut->zBuf[uVar3] = '0';
        }
        else {
          jsonAppendCharExpand(pOut,'0');
        }
      }
      uVar15 = 1;
      if (uVar10 < local_3c) {
        do {
          uVar5 = puVar13[uVar11];
          uVar3 = pOut->nUsed;
          if (uVar3 < pOut->nAlloc) {
            pOut->nUsed = uVar3 + 1;
            pOut->zBuf[uVar3] = uVar5;
          }
          else {
            jsonAppendCharExpand(pOut,uVar5);
          }
          if ((puVar13[uVar11] == '.') &&
             ((uVar8 - 1 == uVar11 || ((ulong)puVar13[uVar11 + 1] - 0x3a < 0xfffffffffffffff6)))) {
            uVar3 = pOut->nUsed;
            if (uVar3 < pOut->nAlloc) {
              pOut->nUsed = uVar3 + 1;
              pOut->zBuf[uVar3] = '0';
            }
            else {
              jsonAppendCharExpand(pOut,'0');
            }
          }
          uVar11 = uVar11 + 1;
          uVar15 = local_3c;
        } while (uVar8 != uVar11);
      }
      goto LAB_001ab39c;
    }
    break;
  case 7:
  case 8:
    uVar8 = pOut->nUsed;
    if (uVar8 < pOut->nAlloc) {
      pOut->nUsed = uVar8 + 1;
      pOut->zBuf[uVar8] = '\"';
    }
    else {
      jsonAppendCharExpand(pOut,'\"');
    }
    jsonAppendRaw(pOut,(char *)(pParse->aBlob + (uVar6 + i)),local_3c);
    uVar15 = local_3c;
    goto LAB_001ab327;
  case 9:
    uVar8 = pOut->nUsed;
    if (uVar8 < pOut->nAlloc) {
      pOut->nUsed = uVar8 + 1;
      pOut->zBuf[uVar8] = '\"';
    }
    else {
      jsonAppendCharExpand(pOut,'\"');
    }
    if (local_3c != 0) {
      puVar13 = puVar13 + (uVar6 + i);
      uVar10 = local_3c;
      do {
        uVar8 = 0;
        while (((ulong)puVar13[uVar8] == 0x27 || (""[puVar13[uVar8]] != '\0'))) {
          uVar8 = uVar8 + 1;
          if (uVar10 == uVar8) {
            jsonAppendRawNZ(pOut,(char *)puVar13,uVar10);
            goto LAB_001ab327;
          }
        }
        if (uVar8 != 0) {
          jsonAppendRawNZ(pOut,(char *)puVar13,(u32)uVar8);
          puVar13 = puVar13 + (uVar8 & 0xffffffff);
          uVar10 = uVar10 - (u32)uVar8;
        }
        uVar5 = *puVar13;
        if (uVar5 == '\"') {
          jsonAppendRawNZ(pOut,"\\\"",2);
LAB_001ab1ab:
          puVar13 = puVar13 + 1;
          uVar10 = uVar10 - 1;
        }
        else {
          if ((char)uVar5 < ' ') {
            if (pOut->nAlloc < pOut->nUsed + 7) {
              iVar7 = jsonStringGrow(pOut,7);
              if (iVar7 != 0) break;
              uVar5 = *puVar13;
            }
            jsonAppendControlChar(pOut,uVar5);
            goto LAB_001ab1ab;
          }
          if (uVar10 < 2) {
            pOut->eErr = pOut->eErr | 2;
            break;
          }
          bVar2 = puVar13[1];
          if (bVar2 < 0x30) {
            if (bVar2 != 10) {
              if (bVar2 == 0xd) {
                if (uVar10 == 2) goto LAB_001ab2a6;
                puVar1 = puVar13 + 2;
                if (*puVar1 == '\n') {
                  puVar13 = puVar13 + 1;
                }
                uVar10 = uVar10 - (*puVar1 == '\n');
              }
              else {
                if (bVar2 != 0x27) goto LAB_001ab269;
                uVar8 = pOut->nUsed;
                if (uVar8 < pOut->nAlloc) {
                  pOut->nUsed = uVar8 + 1;
                  pOut->zBuf[uVar8] = '\'';
                }
                else {
                  jsonAppendCharExpand(pOut,'\'');
                }
              }
            }
          }
          else if (bVar2 < 0x78) {
            if (bVar2 == 0x30) {
              pcVar12 = "\\u0000";
LAB_001ab280:
              N = 6;
            }
            else {
              if (bVar2 == 0x76) {
                pcVar12 = "\\u0009";
                goto LAB_001ab280;
              }
LAB_001ab269:
              N = 2;
              pcVar12 = (char *)puVar13;
            }
            jsonAppendRawNZ(pOut,pcVar12,N);
          }
          else {
            if (bVar2 == 0x78) {
              if (3 < uVar10) {
                jsonAppendRawNZ(pOut,"\\u00",4);
                jsonAppendRawNZ(pOut,(char *)(puVar13 + 2),2);
                puVar13 = puVar13 + 2;
                uVar10 = uVar10 - 2;
                goto LAB_001ab308;
              }
            }
            else if (bVar2 != 0xe2) goto LAB_001ab269;
            pOut->eErr = pOut->eErr | 2;
LAB_001ab2a6:
            uVar10 = 2;
          }
LAB_001ab308:
          puVar13 = puVar13 + 2;
          uVar10 = uVar10 - 2;
        }
      } while (uVar10 != 0);
    }
LAB_001ab327:
    uVar8 = pOut->nUsed;
    if (uVar8 < pOut->nAlloc) {
      pOut->nUsed = uVar8 + 1;
      pOut->zBuf[uVar8] = '\"';
      goto LAB_001ab39c;
    }
    cVar9 = '\"';
    goto LAB_001ab397;
  case 10:
    jsonAppendString(pOut,(char *)(puVar13 + (uVar6 + i)),local_3c);
    goto LAB_001ab39c;
  case 0xb:
    uVar8 = pOut->nUsed;
    if (uVar8 < pOut->nAlloc) {
      pOut->nUsed = uVar8 + 1;
      pOut->zBuf[uVar8] = '[';
    }
    else {
      jsonAppendCharExpand(pOut,'[');
    }
    uVar10 = uVar6 + i;
    uVar14 = local_3c + uVar10;
    while ((uVar10 < uVar14 && (pOut->eErr == '\0'))) {
      uVar10 = jsonTranslateBlobToText(pParse,uVar10,pOut);
      uVar8 = pOut->nUsed;
      if (uVar8 < pOut->nAlloc) {
        pOut->nUsed = uVar8 + 1;
        pOut->zBuf[uVar8] = ',';
      }
      else {
        jsonAppendCharExpand(pOut,',');
      }
    }
    if (uVar14 < uVar10) {
      pOut->eErr = pOut->eErr | 2;
    }
    if (local_3c == 0) {
      uVar8 = pOut->nUsed;
    }
    else {
      uVar8 = pOut->nUsed;
      if (pOut->eErr == '\0') {
        uVar8 = uVar8 - 1;
        pOut->nUsed = uVar8;
      }
    }
    uVar15 = local_3c;
    if (uVar8 < pOut->nAlloc) {
      pOut->nUsed = uVar8 + 1;
      pOut->zBuf[uVar8] = ']';
      goto LAB_001ab39c;
    }
    cVar9 = ']';
    goto LAB_001ab397;
  case 0xc:
    uVar8 = pOut->nUsed;
    if (uVar8 < pOut->nAlloc) {
      pOut->nUsed = uVar8 + 1;
      pOut->zBuf[uVar8] = '{';
    }
    else {
      jsonAppendCharExpand(pOut,'{');
    }
    uVar10 = uVar6 + i;
    local_38 = (ulong)local_3c;
    uVar14 = local_3c + uVar10;
    bVar4 = false;
    while ((uVar10 < uVar14 && (pOut->eErr == '\0'))) {
      uVar10 = jsonTranslateBlobToText(pParse,uVar10,pOut);
      cVar9 = ',';
      if (!bVar4) {
        cVar9 = ':';
      }
      uVar8 = pOut->nUsed;
      if (uVar8 < pOut->nAlloc) {
        pOut->nUsed = uVar8 + 1;
        pOut->zBuf[uVar8] = cVar9;
      }
      else {
        jsonAppendCharExpand(pOut,cVar9);
      }
      bVar4 = (bool)(bVar4 ^ 1);
    }
    if ((uVar14 < uVar10) || (bVar4)) {
      pOut->eErr = pOut->eErr | 2;
    }
    uVar15 = (u32)local_38;
    if (uVar15 == 0) {
      uVar8 = pOut->nUsed;
    }
    else {
      uVar8 = pOut->nUsed;
      if (pOut->eErr == '\0') {
        uVar8 = uVar8 - 1;
        pOut->nUsed = uVar8;
      }
    }
    if (uVar8 < pOut->nAlloc) {
      pOut->nUsed = uVar8 + 1;
      pOut->zBuf[uVar8] = '}';
      goto LAB_001ab39c;
    }
    cVar9 = '}';
LAB_001ab397:
    jsonAppendCharExpand(pOut,cVar9);
    goto LAB_001ab39c;
  default:
    goto switchD_001aada7_default;
  }
  local_3c = 0;
switchD_001aada7_default:
  pOut->eErr = pOut->eErr | 2;
  uVar15 = local_3c;
LAB_001ab39c:
  return uVar6 + i + uVar15;
}

Assistant:

static u32 jsonTranslateBlobToText(
  const JsonParse *pParse,       /* the complete parse of the JSON */
  u32 i,                         /* Start rendering at this index */
  JsonString *pOut               /* Write JSON here */
){
  u32 sz, n, j, iEnd;

  n = jsonbPayloadSize(pParse, i, &sz);
  if( n==0 ){
    pOut->eErr |= JSTRING_MALFORMED;
    return pParse->nBlob+1;
  }
  switch( pParse->aBlob[i] & 0x0f ){
    case JSONB_NULL: {
      jsonAppendRawNZ(pOut, "null", 4);
      return i+1;
    }
    case JSONB_TRUE: {
      jsonAppendRawNZ(pOut, "true", 4);
      return i+1;
    }
    case JSONB_FALSE: {
      jsonAppendRawNZ(pOut, "false", 5);
      return i+1;
    }
    case JSONB_INT:
    case JSONB_FLOAT: {
      if( sz==0 ) goto malformed_jsonb;
      jsonAppendRaw(pOut, (const char*)&pParse->aBlob[i+n], sz);
      break;
    }
    case JSONB_INT5: {  /* Integer literal in hexadecimal notation */
      u32 k = 2;
      sqlite3_uint64 u = 0;
      const char *zIn = (const char*)&pParse->aBlob[i+n];
      int bOverflow = 0;
      if( sz==0 ) goto malformed_jsonb;
      if( zIn[0]=='-' ){
        jsonAppendChar(pOut, '-');
        k++;
      }else if( zIn[0]=='+' ){
        k++;
      }
      for(; k<sz; k++){
        if( !sqlite3Isxdigit(zIn[k]) ){
          pOut->eErr |= JSTRING_MALFORMED;
          break;
        }else if( (u>>60)!=0 ){
          bOverflow = 1;
        }else{
          u = u*16 + sqlite3HexToInt(zIn[k]);
        }
      }
      jsonPrintf(100,pOut,bOverflow?"9.0e999":"%llu", u);
      break;
    }
    case JSONB_FLOAT5: { /* Float literal missing digits beside "." */
      u32 k = 0;
      const char *zIn = (const char*)&pParse->aBlob[i+n];
      if( sz==0 ) goto malformed_jsonb;
      if( zIn[0]=='-' ){
        jsonAppendChar(pOut, '-');
        k++;
      }
      if( zIn[k]=='.' ){
        jsonAppendChar(pOut, '0');
      }
      for(; k<sz; k++){
        jsonAppendChar(pOut, zIn[k]);
        if( zIn[k]=='.' && (k+1==sz || !sqlite3Isdigit(zIn[k+1])) ){
          jsonAppendChar(pOut, '0');
        }
      }
      break;
    }
    case JSONB_TEXT:
    case JSONB_TEXTJ: {
      jsonAppendChar(pOut, '"');
      jsonAppendRaw(pOut, (const char*)&pParse->aBlob[i+n], sz);
      jsonAppendChar(pOut, '"');
      break;
    }
    case JSONB_TEXT5: {
      const char *zIn;
      u32 k;
      u32 sz2 = sz;
      zIn = (const char*)&pParse->aBlob[i+n];
      jsonAppendChar(pOut, '"');
      while( sz2>0 ){
        for(k=0; k<sz2 && (jsonIsOk[(u8)zIn[k]] || zIn[k]=='\''); k++){}
        if( k>0 ){
          jsonAppendRawNZ(pOut, zIn, k);
          if( k>=sz2 ){
            break;
          }
          zIn += k;
          sz2 -= k;
        }
        if( zIn[0]=='"' ){
          jsonAppendRawNZ(pOut, "\\\"", 2);
          zIn++;
          sz2--;
          continue;
        }
        if( zIn[0]<=0x1f ){
          if( pOut->nUsed+7>pOut->nAlloc && jsonStringGrow(pOut,7) ) break;
          jsonAppendControlChar(pOut, zIn[0]);
          zIn++;
          sz2--;
          continue;
        }
        assert( zIn[0]=='\\' );
        assert( sz2>=1 );
        if( sz2<2 ){
          pOut->eErr |= JSTRING_MALFORMED;
          break;
        }
        switch( (u8)zIn[1] ){
          case '\'':
            jsonAppendChar(pOut, '\'');
            break;
          case 'v':
            jsonAppendRawNZ(pOut, "\\u0009", 6);
            break;
          case 'x':
            if( sz2<4 ){
              pOut->eErr |= JSTRING_MALFORMED;
              sz2 = 2;
              break;
            }
            jsonAppendRawNZ(pOut, "\\u00", 4);
            jsonAppendRawNZ(pOut, &zIn[2], 2);
            zIn += 2;
            sz2 -= 2;
            break;
          case '0':
            jsonAppendRawNZ(pOut, "\\u0000", 6);
            break;
          case '\r':
            if( sz2>2 && zIn[2]=='\n' ){
              zIn++;
              sz2--;
            }
            break;
          case '\n':
            break;
          case 0xe2:
            /* '\' followed by either U+2028 or U+2029 is ignored as
            ** whitespace.  Not that in UTF8, U+2028 is 0xe2 0x80 0x29.
            ** U+2029 is the same except for the last byte */
            if( sz2<4
             || 0x80!=(u8)zIn[2]
             || (0xa8!=(u8)zIn[3] && 0xa9!=(u8)zIn[3])
            ){
              pOut->eErr |= JSTRING_MALFORMED;
              sz2 = 2;
              break;
            }
            zIn += 2;
            sz2 -= 2;
            break;
          default:
            jsonAppendRawNZ(pOut, zIn, 2);
            break;
        }
        assert( sz2>=2 );
        zIn += 2;
        sz2 -= 2;
      }
      jsonAppendChar(pOut, '"');
      break;
    }
    case JSONB_TEXTRAW: {
      jsonAppendString(pOut, (const char*)&pParse->aBlob[i+n], sz);
      break;
    }
    case JSONB_ARRAY: {
      jsonAppendChar(pOut, '[');
      j = i+n;
      iEnd = j+sz;
      while( j<iEnd && pOut->eErr==0 ){
        j = jsonTranslateBlobToText(pParse, j, pOut);
        jsonAppendChar(pOut, ',');
      }
      if( j>iEnd ) pOut->eErr |= JSTRING_MALFORMED;
      if( sz>0 ) jsonStringTrimOneChar(pOut);
      jsonAppendChar(pOut, ']');
      break;
    }
    case JSONB_OBJECT: {
      int x = 0;
      jsonAppendChar(pOut, '{');
      j = i+n;
      iEnd = j+sz;
      while( j<iEnd && pOut->eErr==0 ){
        j = jsonTranslateBlobToText(pParse, j, pOut);
        jsonAppendChar(pOut, (x++ & 1) ? ',' : ':');
      }
      if( (x & 1)!=0 || j>iEnd ) pOut->eErr |= JSTRING_MALFORMED;
      if( sz>0 ) jsonStringTrimOneChar(pOut);
      jsonAppendChar(pOut, '}');
      break;
    }

    default: {
      malformed_jsonb:
      pOut->eErr |= JSTRING_MALFORMED;
      break;
    }
  }
  return i+n+sz;
}